

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::FmaCase::compare(FmaCase *this,void **inputs,void **outputs)

{
  float fVar1;
  byte bVar2;
  uint uVar3;
  ostream *os;
  ulong uVar4;
  ostringstream *this_00;
  bool bVar5;
  double dVar6;
  double dVar7;
  Interval ref;
  Interval local_48;
  
  uVar3 = glu::getDataTypeScalarSize
                    ((((this->super_CommonFunctionCase).m_spec.inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  bVar5 = (int)uVar3 < 1;
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      fVar1 = *(float *)((long)*outputs + uVar4 * 4);
      fma((double)(ulong)*(uint *)((long)*inputs + uVar4 * 4),
          (double)(ulong)*(uint *)((long)inputs[1] + uVar4 * 4),
          (double)(ulong)*(uint *)((long)inputs[2] + uVar4 * 4));
      dVar6 = (double)fVar1;
      dVar7 = dVar6;
      if (NAN(fVar1)) {
        dVar7 = INFINITY;
        dVar6 = -INFINITY;
      }
      bVar2 = local_48.m_lo <= dVar7 && dVar6 <= local_48.m_hi;
      if ((NAN(fVar1)) && (local_48.m_lo <= dVar7 && dVar6 <= local_48.m_hi)) {
        bVar2 = local_48.m_hasNaN;
      }
      if ((bVar2 & 1) == 0) {
        this_00 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        os = (ostream *)std::ostream::operator<<(this_00,(int)uVar4);
        std::__ostream_insert<char,std::char_traits<char>>(os,"] = ",4);
        tcu::operator<<(os,&local_48);
        return bVar5;
      }
      uVar4 = uVar4 + 1;
      bVar5 = uVar3 <= uVar4;
    } while (uVar4 != uVar3);
  }
  return bVar5;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float			a			= ((const float*)inputs[0])[compNdx];
			const float			b			= ((const float*)inputs[1])[compNdx];
			const float			c			= ((const float*)inputs[2])[compNdx];
			const float			res			= ((const float*)outputs[0])[compNdx];
			const tcu::Interval	ref			= fma(precision, a, b, c);

			if (!ref.contains(res))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << ref;
				return false;
			}
		}

		return true;
	}